

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::KillUnreadRegVmRegister(CodeGenGenericContext *this,uchar regId)

{
  x86Argument local_38;
  uchar local_11;
  CodeGenGenericContext *pCStack_10;
  uchar regId_local;
  CodeGenGenericContext *this_local;
  
  local_11 = regId;
  pCStack_10 = this;
  x86Argument::x86Argument(&local_38,sQWORD,rEBX,(uint)regId << 3);
  MemKillDeadStore(this,&local_38);
  return;
}

Assistant:

void CodeGenGenericContext::KillUnreadRegVmRegister(unsigned char regId)
{
	MemKillDeadStore(x86Argument(sQWORD, rRBX, regId * 8));
}